

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# legacy.c
# Opt level: O0

xmlChar * xmlParseQuotedString(xmlParserCtxtPtr ctxt)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlParserCtxtPtr ctxt_local;
  
  if (xmlParseQuotedString::deprecated == 0) {
    pp_Var2 = __xmlGenericError();
    p_Var1 = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar3,"xmlParseQuotedString() deprecated function reached\n");
    xmlParseQuotedString::deprecated = 1;
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlParseQuotedString(xmlParserCtxtPtr ctxt ATTRIBUTE_UNUSED)
{
    static int deprecated = 0;

    if (!deprecated) {
        xmlGenericError(xmlGenericErrorContext,
                        "xmlParseQuotedString() deprecated function reached\n");
        deprecated = 1;
    }
    return (NULL);
}